

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryStoreTestCase.cpp
# Opt level: O3

void __thiscall memoryStoreFixture::memoryStoreFixture(memoryStoreFixture *this,bool reset)

{
  MessageStore *pMVar1;
  SessionID sessionID;
  long *local_308;
  long local_300;
  long local_2f8 [2];
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  string local_2a8;
  FieldBase local_288;
  undefined1 local_230 [264];
  FieldBase local_128;
  FieldBase local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  *(code **)this = FIX::SocketServer::accept;
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"FIX.4.2","");
  local_288._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00320f80;
  local_288.m_tag = 8;
  local_288.m_string._M_dataplus._M_p = (pointer)&local_288.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288.m_string,local_2c8,local_2c0 + (long)local_2c8);
  local_288.m_data._M_dataplus._M_p = (pointer)&local_288.m_data.field_2;
  local_288.m_data._M_string_length = 0;
  local_288.m_data.field_2._M_local_buf[0] = '\0';
  local_288.m_metrics.m_length = 0;
  local_288.m_metrics.m_checksum = 0;
  local_288._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325970;
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"SETGET","");
  local_230._0_8_ = &PTR__FieldBase_00320f80;
  local_230._8_4_ = 0x31;
  local_230._16_8_ = local_230 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_230 + 0x10),local_2e8,local_2e0 + (long)local_2e8);
  local_230._48_8_ = local_230 + 0x40;
  local_230._56_8_ = 0;
  local_230[0x40] = '\0';
  local_230._80_4_ = 0;
  local_230._84_4_ = 0;
  local_230._0_8_ = &PTR__FieldBase_00325010;
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"TEST","");
  local_230._88_8_ = &PTR__FieldBase_00320f80;
  local_230._96_4_ = 0x38;
  local_230._104_8_ = local_230 + 0x78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_230 + 0x68),local_308,local_300 + (long)local_308);
  local_230._136_8_ = local_230 + 0x98;
  local_230._144_8_ = 0;
  local_230[0x98] = '\0';
  local_230._168_4_ = 0;
  local_230._172_4_ = 0;
  local_230._88_8_ = &PTR__FieldBase_00325400;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
  FIX::SessionID::SessionID
            ((SessionID *)(local_230 + 0xb0),&local_288.m_string,(string *)(local_230 + 0x10),
             (string *)(local_230 + 0x68),&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)(local_230 + 0x58));
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_230);
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  FIX::FieldBase::~FieldBase(&local_288);
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  FIX::DateTime::nowUtc();
  local_230._12_4_ = local_288._12_4_;
  local_230._8_4_ = local_288.m_tag;
  local_230._16_8_ = local_288.m_string._M_dataplus._M_p;
  local_230._0_8_ = &PTR__DateTime_003254a8;
  pMVar1 = (MessageStore *)
           FIX::MemoryStoreFactory::create((UtcTimeStamp *)this,(SessionID *)local_230);
  this->object = pMVar1;
  if (reset) {
    FIX::DateTime::nowUtc();
    local_230._12_4_ = local_288._12_4_;
    local_230._8_4_ = local_288.m_tag;
    local_230._16_8_ = local_288.m_string._M_dataplus._M_p;
    local_230._0_8_ = &PTR__DateTime_003254a8;
    (*pMVar1->_vptr_MessageStore[0xb])(pMVar1);
  }
  this->resetAfter = reset;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase(&local_d0);
  FIX::FieldBase::~FieldBase(&local_128);
  FIX::FieldBase::~FieldBase((FieldBase *)(local_230 + 0xb0));
  return;
}

Assistant:

memoryStoreFixture(bool reset) {
    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"));

    try {
      object = factory.create(UtcTimeStamp::now(), sessionID);
    } catch (std::exception &e) {
      std::cerr << e.what() << std::endl;
      throw;
    }

    if (reset) {
      object->reset(UtcTimeStamp::now());
    }

    this->resetAfter = reset;
  }